

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O3

void HTS_ModelSet_clear(HTS_ModelSet *ms)

{
  char **__ptr;
  HTS_Model *__ptr_00;
  HTS_Window *__ptr_01;
  HTS_Model **ppHVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  if (ms->hts_voice_version != (char *)0x0) {
    free(ms->hts_voice_version);
  }
  if (ms->stream_type != (char *)0x0) {
    free(ms->stream_type);
  }
  if (ms->fullcontext_format != (char *)0x0) {
    free(ms->fullcontext_format);
  }
  if (ms->fullcontext_version != (char *)0x0) {
    free(ms->fullcontext_version);
  }
  if (ms->gv_off_context != (HTS_Question *)0x0) {
    HTS_Question_clear(ms->gv_off_context);
    free(ms->gv_off_context);
  }
  __ptr = ms->option;
  if (__ptr != (char **)0x0) {
    uVar4 = ms->num_streams;
    if (uVar4 != 0) {
      uVar2 = 0;
      do {
        if (ms->option[uVar2] != (char *)0x0) {
          free(ms->option[uVar2]);
          uVar4 = ms->num_streams;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < uVar4);
      __ptr = ms->option;
    }
    free(__ptr);
  }
  __ptr_00 = ms->duration;
  if (__ptr_00 != (HTS_Model *)0x0) {
    if (ms->num_voices != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        HTS_Model_clear((HTS_Model *)((long)&ms->duration->vector_length + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x40;
      } while (uVar4 < ms->num_voices);
      __ptr_00 = ms->duration;
    }
    free(__ptr_00);
  }
  __ptr_01 = ms->window;
  if (__ptr_01 != (HTS_Window *)0x0) {
    if (ms->num_streams != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        HTS_Window_clear((HTS_Window *)((long)&ms->window->size + lVar3));
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x28;
      } while (uVar4 < ms->num_streams);
      __ptr_01 = ms->window;
    }
    free(__ptr_01);
  }
  ppHVar1 = ms->stream;
  if (ppHVar1 != (HTS_Model **)0x0) {
    if (ms->num_voices != 0) {
      uVar4 = 0;
      do {
        if (ms->num_streams != 0) {
          lVar3 = 0;
          uVar2 = 0;
          do {
            HTS_Model_clear((HTS_Model *)((long)&ms->stream[uVar4]->vector_length + lVar3));
            uVar2 = uVar2 + 1;
            lVar3 = lVar3 + 0x40;
          } while (uVar2 < ms->num_streams);
        }
        free(ms->stream[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar4 < ms->num_voices);
      ppHVar1 = ms->stream;
    }
    HTS_free(ppHVar1);
  }
  ppHVar1 = ms->gv;
  if (ppHVar1 != (HTS_Model **)0x0) {
    if (ms->num_voices != 0) {
      uVar4 = 0;
      do {
        if (ms->num_streams != 0) {
          lVar3 = 0;
          uVar2 = 0;
          do {
            HTS_Model_clear((HTS_Model *)((long)&ms->gv[uVar4]->vector_length + lVar3));
            uVar2 = uVar2 + 1;
            lVar3 = lVar3 + 0x40;
          } while (uVar2 < ms->num_streams);
        }
        free(ms->gv[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar4 < ms->num_voices);
      ppHVar1 = ms->gv;
    }
    free(ppHVar1);
  }
  ms->window = (HTS_Window *)0x0;
  ms->stream = (HTS_Model **)0x0;
  ms->option = (char **)0x0;
  ms->duration = (HTS_Model *)0x0;
  ms->fullcontext_version = (char *)0x0;
  ms->gv_off_context = (HTS_Question *)0x0;
  ms->stream_type = (char *)0x0;
  ms->fullcontext_format = (char *)0x0;
  ms->num_states = 0;
  ms->num_streams = 0;
  ms->frame_period = 0;
  ms->num_voices = 0;
  ms->hts_voice_version = (char *)0x0;
  ms->sampling_frequency = 0;
  ms->gv = (HTS_Model **)0x0;
  return;
}

Assistant:

void HTS_ModelSet_clear(HTS_ModelSet * ms)
{
   size_t i, j;

   if (ms->hts_voice_version != NULL)
      free(ms->hts_voice_version);
   if (ms->stream_type != NULL)
      free(ms->stream_type);
   if (ms->fullcontext_format != NULL)
      free(ms->fullcontext_format);
   if (ms->fullcontext_version != NULL)
      free(ms->fullcontext_version);
   if (ms->gv_off_context != NULL) {
      HTS_Question_clear(ms->gv_off_context);
      free(ms->gv_off_context);
   }
   if (ms->option != NULL) {
      for (i = 0; i < ms->num_streams; i++)
         if (ms->option[i] != NULL)
            free(ms->option[i]);
      free(ms->option);
   }

   if (ms->duration != NULL) {
      for (i = 0; i < ms->num_voices; i++)
         HTS_Model_clear(&ms->duration[i]);
      free(ms->duration);
   }
   if (ms->window != NULL) {
      for (i = 0; i < ms->num_streams; i++)
         HTS_Window_clear(&ms->window[i]);
      free(ms->window);
   }
   if (ms->stream != NULL) {
      for (i = 0; i < ms->num_voices; i++) {
         for (j = 0; j < ms->num_streams; j++)
            HTS_Model_clear(&ms->stream[i][j]);
         free(ms->stream[i]);
      }
      HTS_free(ms->stream);
   }
   if (ms->gv != NULL) {
      for (i = 0; i < ms->num_voices; i++) {
         for (j = 0; j < ms->num_streams; j++)
            HTS_Model_clear(&ms->gv[i][j]);
         free(ms->gv[i]);
      }
      free(ms->gv);
   }
   HTS_ModelSet_initialize(ms);
}